

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::WriteHighLevelDirectives
          (cmGlobalGhsMultiGenerator *this,ostream *fout,cmLocalGenerator *root)

{
  bool bVar1;
  cmMakefile *pcVar2;
  ostream *poVar3;
  string *psVar4;
  cmake *this_00;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  string local_c0;
  string *local_a0;
  allocator<char> local_91;
  string local_90;
  cmValue local_70;
  cmValue customization;
  allocator<char> local_49;
  string local_48;
  cmValue local_28;
  cmValue tgt;
  cmLocalGenerator *root_local;
  ostream *fout_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  tgt.Value = (string *)root;
  pcVar2 = cmLocalGenerator::GetMakefile(root);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"GHS_PRIMARY_TARGET",&local_49);
  local_28 = cmMakefile::GetDefinition(pcVar2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  poVar3 = std::operator<<(fout,"primaryTarget=");
  customization.Value = local_28.Value;
  poVar3 = ::operator<<(poVar3,local_28);
  poVar3 = std::operator<<(poVar3,"\ncustomization=");
  psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(tgt.Value);
  poVar3 = std::operator<<(poVar3,(string *)psVar4);
  poVar3 = std::operator<<(poVar3,"/CMakeFiles/custom_rule.bod\ncustomization=");
  psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(tgt.Value);
  poVar3 = std::operator<<(poVar3,(string *)psVar4);
  poVar3 = std::operator<<(poVar3,"/CMakeFiles/custom_target.bod");
  std::operator<<(poVar3,'\n');
  pcVar2 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)tgt.Value);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"GHS_CUSTOMIZATION",&local_91);
  local_70 = cmMakefile::GetDefinition(pcVar2,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  local_a0 = local_70.Value;
  bVar1 = cmNonempty(local_70);
  if (bVar1) {
    poVar3 = std::operator<<(fout,"customization=");
    psVar4 = cmValue::operator*[abi_cxx11_(&local_70);
    std::__cxx11::string::string((string *)&local_e0,(string *)psVar4);
    TrimQuotes(&local_c0,&local_e0);
    poVar3 = std::operator<<(poVar3,(string *)&local_c0);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    this_00 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"GHS_CUSTOMIZATION",&local_101);
    cmake::MarkCliAsUsed(this_00,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteHighLevelDirectives(
  std::ostream& fout, cmLocalGenerator* root)
{
  /* put primary target and customization files into project file */
  cmValue const tgt = root->GetMakefile()->GetDefinition("GHS_PRIMARY_TARGET");

  /* clang-format off */
  fout << "primaryTarget=" << tgt << "\n"
          "customization=" << root->GetBinaryDirectory()
       << "/CMakeFiles/custom_rule.bod\n"
          "customization=" << root->GetBinaryDirectory()
       << "/CMakeFiles/custom_target.bod" << '\n';
  /* clang-format on */

  cmValue const customization =
    root->GetMakefile()->GetDefinition("GHS_CUSTOMIZATION");
  if (cmNonempty(customization)) {
    fout << "customization="
         << cmGlobalGhsMultiGenerator::TrimQuotes(*customization) << '\n';
    this->GetCMakeInstance()->MarkCliAsUsed("GHS_CUSTOMIZATION");
  }
}